

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

quad<unsigned_char> __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
           *this,quad<unsigned_char> x,quad<unsigned_char> ra,quad<unsigned_char> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  uVar1 = (uint)rb >> 8;
  uVar3 = (uint)rb >> 0x10;
  uVar2 = (uint)rb >> 0x18;
  uVar4 = -(uint)(((uint)rb & 0xff) < ((uint)ra & 0xff)) | 1;
  iVar7 = ((int)x - (int)rb) * uVar4;
  context = &this->context_run_mode_;
  encode_run_interruption_error(this,context->_M_elems,(int)(char)iVar7);
  uVar10 = -(uint)((uVar1 & 0xff) < ((uint)ra >> 8 & 0xff)) | 1;
  iVar11 = (((uint)x >> 8) - uVar1) * uVar10;
  encode_run_interruption_error(this,context->_M_elems,(int)(char)iVar11);
  uVar8 = -(uint)((uVar3 & 0xff) < ((uint)ra >> 0x10 & 0xff)) | 1;
  iVar6 = (((uint)x >> 0x10) - uVar3) * uVar8;
  encode_run_interruption_error(this,context->_M_elems,(int)(char)iVar6);
  uVar5 = -(uint)(uVar2 < (uint)ra >> 0x18) | 1;
  iVar9 = (((uint)x >> 0x18) - uVar2) * uVar5;
  encode_run_interruption_error(this,context->_M_elems,(int)(char)iVar9);
  return (quad<unsigned_char>)
         ((iVar6 * uVar8 + uVar3 & 0xff) << 0x10 |
         (iVar9 * uVar5 + uVar2) * 0x1000000 | iVar7 * uVar4 + (int)rb & 0xff |
         (iVar11 * uVar10 + uVar1 & 0xff) << 8);
}

Assistant:

quad<sample_type> encode_run_interruption_pixel(const quad<sample_type> x, const quad<sample_type> ra,
                                                    const quad<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        const int32_t error_value4{traits_.compute_error_value(sign(rb.v4 - ra.v4) * (x.v4 - rb.v4))};
        encode_run_interruption_error(context_run_mode_[0], error_value4);

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }